

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O2

void CheckStackTrace(int i)

{
  int j;
  CheckOpString local_70;
  LogMessage local_68;
  
  expected_range[5].start = (void *)0x10866e;
  expected_range[5].end = (void *)0x10867d;
  local_70.str_ =
       google::Check_LTImpl<void_const*,void_const*>
                 (&expected_range[5].start,&expected_range[5].end,
                  "(&expected_range[5])->start < (&expected_range[5])->end");
  if (local_70.str_ == (string *)0x0) {
    for (; -1 < i; i = i + -1) {
      CheckStackTrace1(i);
    }
    return;
  }
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
             ,0xda,&local_70);
  google::LogMessage::stream(&local_68);
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

void ATTRIBUTE_NOINLINE
    CheckStackTrace(int i) {
  INIT_ADDRESS_RANGE(CheckStackTrace, start, end, &expected_range[5]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTrace1(j);
  }
  DECLARE_ADDRESS_LABEL(end);
}